

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL Js::RecyclableObjectDisplay::GetPropertyWithScriptEnter
               (RecyclableObject *originalInstance,RecyclableObject *instance,PropertyId propertyId,
               Var *value,ScriptContext *scriptContext)

{
  undefined4 uVar1;
  bool bVar2;
  ThreadContext *pTVar3;
  void *unaff_retaddr;
  undefined1 local_c0 [8];
  EnterScriptObject __enterScriptObject;
  ScriptEntryExitRecord __entryExitRecord;
  ScriptContext *__localScriptContext;
  undefined1 local_48 [8];
  TTModeStackAutoPopper suppressModeAutoPopper;
  BOOL retValue;
  ScriptContext *scriptContext_local;
  Var *value_local;
  PropertyId propertyId_local;
  RecyclableObject *instance_local;
  RecyclableObject *originalInstance_local;
  
  suppressModeAutoPopper._12_4_ = 0;
  pTVar3 = ScriptContext::GetThreadContext(scriptContext);
  TTD::TTModeStackAutoPopper::TTModeStackAutoPopper
            ((TTModeStackAutoPopper *)local_48,pTVar3->TTDLog);
  pTVar3 = ScriptContext::GetThreadContext(scriptContext);
  bVar2 = ThreadContext::IsRuntimeInTTDMode(pTVar3);
  if (bVar2) {
    TTD::TTModeStackAutoPopper::PushModeAndSetToAutoPop
              ((TTModeStackAutoPopper *)local_48,DebuggerSuppressGetter);
  }
  pTVar3 = ScriptContext::GetThreadContext(scriptContext);
  bVar2 = ThreadContext::IsScriptActive(pTVar3);
  if (bVar2) {
    suppressModeAutoPopper._12_4_ =
         Js::JavascriptOperators::GetProperty
                   (originalInstance,instance,propertyId,value,scriptContext,
                    (PropertyValueInfo *)0x0);
  }
  else {
    __enterScriptObject.library = (JavascriptLibrary *)0x0;
    EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_c0,scriptContext,
               (ScriptEntryExitRecord *)&__enterScriptObject.library,unaff_retaddr,&stack0x00000000,
               false,false,false);
    ScriptContext::OnScriptStart(scriptContext,false,true);
    EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_c0);
    suppressModeAutoPopper._12_4_ =
         Js::JavascriptOperators::GetProperty
                   (originalInstance,instance,propertyId,value,scriptContext,
                    (PropertyValueInfo *)0x0);
    EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_c0);
  }
  uVar1 = suppressModeAutoPopper._12_4_;
  TTD::TTModeStackAutoPopper::~TTModeStackAutoPopper((TTModeStackAutoPopper *)local_48);
  return uVar1;
}

Assistant:

BOOL RecyclableObjectDisplay::GetPropertyWithScriptEnter(RecyclableObject* originalInstance, RecyclableObject* instance, PropertyId propertyId, Var* value, ScriptContext* scriptContext)
    {
        BOOL retValue = FALSE;

#if ENABLE_TTD
        TTD::TTModeStackAutoPopper suppressModeAutoPopper(scriptContext->GetThreadContext()->TTDLog);
        if(scriptContext->GetThreadContext()->IsRuntimeInTTDMode())
        {
            suppressModeAutoPopper.PushModeAndSetToAutoPop(TTD::TTDMode::DebuggerSuppressGetter);
        }
#endif

        if(!scriptContext->GetThreadContext()->IsScriptActive())
        {
            BEGIN_JS_RUNTIME_CALL_EX(scriptContext, false)
            {
                IGNORE_STACKWALK_EXCEPTION(scriptContext);
                retValue = Js::JavascriptOperators::GetProperty(originalInstance, instance, propertyId, value, scriptContext);
            }
            END_JS_RUNTIME_CALL(scriptContext);
        }
        else
        {
            retValue = Js::JavascriptOperators::GetProperty(originalInstance, instance, propertyId, value, scriptContext);
        }

        return retValue;
    }